

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLib.c
# Opt level: O1

JL_STATUS JlStructToJson(void *Structure,JlMarshallElement *StructDescription,
                        size_t StructDescriptionCount,_Bool IndentedFormat,char **pJsonStringBuffer)

{
  JL_STATUS JVar1;
  undefined7 in_register_00000009;
  
  JVar1 = JlStructToJsonEx(Structure,StructDescription,StructDescriptionCount,
                           (ulong)(uint)((int)CONCAT71(in_register_00000009,IndentedFormat) * 2),
                           pJsonStringBuffer);
  return JVar1;
}

Assistant:

JL_STATUS
    JlStructToJson
    (
        void const*                 Structure,                      // [in]
        JlMarshallElement const*    StructDescription,              // [in]
        size_t                      StructDescriptionCount,         // [in]
        bool                        IndentedFormat,                 // [in]
        char**                      pJsonStringBuffer               // [out]
    )
{
    return JlStructToJsonEx(
        Structure,
        StructDescription,
        StructDescriptionCount,
        IndentedFormat ? JL_OUTPUT_FLAGS_INDENT : JL_OUTPUT_FLAGS_NONE,
        pJsonStringBuffer );
}